

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregateStates::Combine
          (WindowAggregateStates *this,WindowAggregateStates *target,
          AggregateCombineType combine_type)

{
  aggregate_combine_t p_Var1;
  FunctionDataWrapper *pFVar2;
  type pVVar3;
  type pVVar4;
  AggregateInputData aggr_input_data;
  AggregateInputData local_48;
  
  if ((this->aggr).bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_48.bind_data.ptr = (FunctionData *)0x0;
  }
  else {
    pFVar2 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                       (&(this->aggr).bind_data_wrapper);
    local_48.bind_data.ptr =
         (pFVar2->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  local_48.allocator = &this->allocator;
  local_48.combine_type = ALLOW_DESTRUCTIVE;
  p_Var1 = (this->aggr).function.combine;
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->statef);
  pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&target->statef);
  (*p_Var1)(pVVar3,pVVar4,&local_48,
            (ulong)((long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                          .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) / this->state_size);
  return;
}

Assistant:

void WindowAggregateStates::Combine(WindowAggregateStates &target, AggregateCombineType combine_type) {
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
	aggr.function.combine(*statef, *target.statef, aggr_input_data, GetCount());
}